

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_dataset_ensure.h
# Opt level: O0

bool __thiscall trimesh::dataset_t::compare_cells<0>(dataset_t *this,cellid_t *c1,cellid_t *c2)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  type ptVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  const_reference pvVar7;
  fn_t f2;
  fn_t f1;
  string local_390 [32];
  stringstream local_370 [8];
  stringstream ss_1;
  ostream local_360 [383];
  undefined1 local_1e1;
  string local_1e0 [48];
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  int *local_28;
  cellid_t *c2_local;
  cellid_t *c1_local;
  dataset_t *this_local;
  
  local_28 = c2;
  c2_local = c1;
  c1_local = (cellid_t *)this;
  ptVar4 = boost::shared_ptr<tri_cc_t>::operator->(&this->m_tcc);
  uVar3 = tri_cc_t::get_cell_dim(ptVar4,*c2_local);
  if (uVar3 != 0) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar5 = std::operator<<(local_1a0,"Failed to assert condition ");
    poVar5 = std::operator<<(poVar5,"m_tcc->get_cell_dim(c1) == 0");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"at (");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_dataset_ensure.h"
                            );
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = std::operator<<(poVar5,"compare_cells");
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x6c);
    std::operator<<(poVar5,") \n ");
    local_1e1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar6,local_1e0);
    local_1e1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ptVar4 = boost::shared_ptr<tri_cc_t>::operator->(&this->m_tcc);
  uVar3 = tri_cc_t::get_cell_dim(ptVar4,*local_28);
  if (uVar3 != 0) {
    std::__cxx11::stringstream::stringstream(local_370);
    poVar5 = std::operator<<(local_360,"Failed to assert condition ");
    poVar5 = std::operator<<(poVar5,"m_tcc->get_cell_dim(c2) == 0");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"at (");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_dataset_ensure.h"
                            );
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = std::operator<<(poVar5,"compare_cells");
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x6d);
    std::operator<<(poVar5,") \n ");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar6,local_390);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                     (this->m_vert_fns,(long)*c2_local);
  dVar1 = *pvVar7;
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                     (this->m_vert_fns,(long)*local_28);
  dVar2 = *pvVar7;
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    this_local._7_1_ = dVar1 < dVar2;
  }
  else {
    this_local._7_1_ = *c2_local < *local_28;
  }
  return this_local._7_1_;
}

Assistant:

inline bool dataset_t::compare_cells<0>(const cellid_t & c1, const cellid_t &c2) const
  {
    ASSERT(m_tcc->get_cell_dim(c1) == 0);
    ASSERT(m_tcc->get_cell_dim(c2) == 0);

    fn_t f1 = m_vert_fns[c1];
    fn_t f2 = m_vert_fns[c2];

    if (f1 != f2)
      return f1 < f2;

    return c1 < c2;
  }